

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_plane.cpp
# Opt level: O0

bool __thiscall ON_Plane::Transform(ON_Plane *this,ON_Xform *xform)

{
  double dVar1;
  bool bVar2;
  bool local_d9;
  ON_3dPoint local_d0;
  ON_3dPoint local_b8;
  undefined1 local_a0 [8];
  ON_3dVector yaxis_vec;
  ON_3dPoint local_70;
  undefined1 local_58 [8];
  ON_3dVector xaxis_vec;
  undefined1 local_38 [7];
  bool bUseVectorXform;
  ON_3dPoint origin_pt;
  ON_Xform *xform_local;
  ON_Plane *this_local;
  
  origin_pt.z = (double)xform;
  bVar2 = ON_Xform::IsIdentity(xform,0.0);
  if (bVar2) {
    this_local._7_1_ = IsValid(this);
  }
  else {
    ON_Xform::operator*((ON_3dPoint *)local_38,(ON_Xform *)origin_pt.z,&this->origin);
    dVar1 = origin_pt.z;
    local_d9 = false;
    if ((*(double *)((long)origin_pt.z + 0x60) == 0.0) &&
       (!NAN(*(double *)((long)origin_pt.z + 0x60)))) {
      local_d9 = false;
      if ((*(double *)((long)origin_pt.z + 0x68) == 0.0) &&
         (!NAN(*(double *)((long)origin_pt.z + 0x68)))) {
        local_d9 = false;
        if ((*(double *)((long)origin_pt.z + 0x70) == 0.0) &&
           (!NAN(*(double *)((long)origin_pt.z + 0x70)))) {
          local_d9 = *(double *)((long)origin_pt.z + 0x78) == 1.0;
        }
      }
    }
    xaxis_vec.z._7_1_ = local_d9;
    if (local_d9 == false) {
      ON_3dPoint::operator+((ON_3dPoint *)&yaxis_vec.z,&this->origin,&this->xaxis);
      ON_Xform::operator*(&local_70,(ON_Xform *)dVar1,(ON_3dPoint *)&yaxis_vec.z);
      ON_3dPoint::operator-((ON_3dVector *)local_58,&local_70,(ON_3dPoint *)local_38);
    }
    else {
      ON_Xform::operator*((ON_3dVector *)local_58,(ON_Xform *)origin_pt.z,&this->xaxis);
    }
    dVar1 = origin_pt.z;
    if ((xaxis_vec.z._7_1_ & 1) == 0) {
      ON_3dPoint::operator+(&local_d0,&this->origin,&this->yaxis);
      ON_Xform::operator*(&local_b8,(ON_Xform *)dVar1,&local_d0);
      ON_3dPoint::operator-((ON_3dVector *)local_a0,&local_b8,(ON_3dPoint *)local_38);
    }
    else {
      ON_Xform::operator*((ON_3dVector *)local_a0,(ON_Xform *)origin_pt.z,&this->yaxis);
    }
    this_local._7_1_ =
         CreateFromFrame(this,(ON_3dPoint *)local_38,(ON_3dVector *)local_58,(ON_3dVector *)local_a0
                        );
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Plane::Transform( const ON_Xform& xform )
{
  if ( xform.IsIdentity() )
  {
    // 27 October 2011 Dale Lear
    //    If the plane is valid and the transformation
    //    is the identity, then NO changes should be
    //    made to the plane's values.  In particular
    //    calling CreateFromFrame() can introduce
    //    slight fuzz.
    //
    //    Please discuss any changes with me.
    return IsValid();
  }

  ON_3dPoint origin_pt = xform*origin;

  // use care transforming vectors to get
  // maximum precision and the right answer
  bool bUseVectorXform = (    0.0 == xform.m_xform[3][0] 
                           && 0.0 == xform.m_xform[3][1]
                           && 0.0 == xform.m_xform[3][2] 
                           && 1.0 == xform.m_xform[3][3]
                         );

  ON_3dVector xaxis_vec = bUseVectorXform ? (xform*xaxis) : ((xform*(origin+xaxis)) - origin_pt);
  ON_3dVector yaxis_vec = bUseVectorXform ? (xform*yaxis) : ((xform*(origin+yaxis)) - origin_pt);

  return CreateFromFrame( origin_pt, xaxis_vec, yaxis_vec );
}